

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

int CfdDecodeBase64(void *handle,char *base64,char **output)

{
  char *pcVar1;
  CfdException *pCVar2;
  allocator local_61;
  undefined1 local_60 [32];
  ByteData data;
  
  cfd::Initialize();
  if ((base64 != (char *)0x0) && (*base64 != '\0')) {
    if (output != (char **)0x0) {
      std::__cxx11::string::string((string *)local_60,base64,&local_61);
      cfd::core::CryptoUtil::DecodeBase64(&data,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_60,&data);
      pcVar1 = cfd::capi::CreateString((string *)local_60);
      *output = pcVar1;
      std::__cxx11::string::~string((string *)local_60);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
      return 0;
    }
    local_60._0_8_ = "cfdcapi_common.cpp";
    local_60._8_4_ = 0x352;
    local_60._16_8_ = "CfdDecodeBase64";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_60,"output is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_60,"Failed to parameter. output is null.",(allocator *)&data);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_60);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_60._0_8_ = "cfdcapi_common.cpp";
  local_60._8_4_ = 0x34c;
  local_60._16_8_ = "CfdDecodeBase64";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_60,"base64 is null or empty.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_60,"Failed to parameter. base64 is null or empty.",(allocator *)&data);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_60);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdDecodeBase64(
    void* handle, const char* base64, char** output) {
  try {
    cfd::Initialize();
    if (cfd::capi::IsEmptyString(base64)) {
      warn(CFD_LOG_SOURCE, "base64 is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. base64 is null or empty.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    auto data = cfd::core::CryptoUtil::DecodeBase64(std::string(base64));
    *output = cfd::capi::CreateString(data.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}